

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O1

WebPMuxImage * MuxImageRelease(WebPMuxImage *wpi)

{
  WebPMuxImage *pWVar1;
  WebPChunk *pWVar2;
  
  if (wpi != (WebPMuxImage *)0x0) {
    pWVar2 = wpi->header_;
    while (pWVar2 != (WebPChunk *)0x0) {
      pWVar2 = ChunkDelete(pWVar2);
      wpi->header_ = pWVar2;
    }
    pWVar2 = wpi->alpha_;
    while (pWVar2 != (WebPChunk *)0x0) {
      pWVar2 = ChunkDelete(pWVar2);
      wpi->alpha_ = pWVar2;
    }
    pWVar2 = wpi->img_;
    while (pWVar2 != (WebPChunk *)0x0) {
      pWVar2 = ChunkDelete(pWVar2);
      wpi->img_ = pWVar2;
    }
    pWVar2 = wpi->unknown_;
    while (pWVar2 != (WebPChunk *)0x0) {
      pWVar2 = ChunkDelete(pWVar2);
      wpi->unknown_ = pWVar2;
    }
    pWVar1 = wpi->next_;
    wpi->header_ = (WebPChunk *)0x0;
    wpi->alpha_ = (WebPChunk *)0x0;
    wpi->img_ = (WebPChunk *)0x0;
    wpi->unknown_ = (WebPChunk *)0x0;
    wpi->width_ = 0;
    wpi->height_ = 0;
    wpi->has_alpha_ = 0;
    wpi->is_partial_ = 0;
    wpi->next_ = (WebPMuxImage *)0x0;
    return pWVar1;
  }
  return (WebPMuxImage *)0x0;
}

Assistant:

WebPMuxImage* MuxImageRelease(WebPMuxImage* const wpi) {
  WebPMuxImage* next;
  if (wpi == NULL) return NULL;
  // There should be at most one chunk of header_, alpha_, img_ but we call
  // ChunkListDelete to be safe
  ChunkListDelete(&wpi->header_);
  ChunkListDelete(&wpi->alpha_);
  ChunkListDelete(&wpi->img_);
  ChunkListDelete(&wpi->unknown_);

  next = wpi->next_;
  MuxImageInit(wpi);
  return next;
}